

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmtime.c
# Opt level: O2

int main(void)

{
  tm *ptVar1;
  time_t t;
  
  t = -0x80000000;
  ptVar1 = gmtime(&t);
  if (ptVar1->tm_sec != 0x34) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x20,"time->tm_sec == 52");
  }
  if (ptVar1->tm_min != 0x2d) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x21,"time->tm_min == 45");
  }
  if (ptVar1->tm_hour != 0x14) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x22,"time->tm_hour == 20");
  }
  if (ptVar1->tm_mday != 0xd) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x23,"time->tm_mday == 13");
  }
  if (ptVar1->tm_mon != 0xb) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x24,"time->tm_mon == 11");
  }
  if (ptVar1->tm_year != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x25,"time->tm_year == 1");
  }
  if (ptVar1->tm_wday != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x26,"time->tm_wday == 5");
  }
  if (ptVar1->tm_yday != 0x15a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x27,"time->tm_yday == 346");
  }
  t = 0x7fffffff;
  ptVar1 = gmtime(&t);
  if (ptVar1->tm_sec != 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x2b,"time->tm_sec == 7");
  }
  if (ptVar1->tm_min != 0xe) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x2c,"time->tm_min == 14");
  }
  if (ptVar1->tm_hour != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x2d,"time->tm_hour == 3");
  }
  if (ptVar1->tm_mday != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x2e,"time->tm_mday == 19");
  }
  if (ptVar1->tm_mon != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x2f,"time->tm_mon == 0");
  }
  if (ptVar1->tm_year != 0x8a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x30,"time->tm_year == 138");
  }
  if (ptVar1->tm_wday != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x31,"time->tm_wday == 2");
  }
  if (ptVar1->tm_yday != 0x12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime.c, line %d - %s\n"
           ,0x32,"time->tm_yday == 18");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    time_t t;
    struct tm * time;

    t = -2147483648l;
    time = gmtime( &t );
    TESTCASE( time->tm_sec == 52 );
    TESTCASE( time->tm_min == 45 );
    TESTCASE( time->tm_hour == 20 );
    TESTCASE( time->tm_mday == 13 );
    TESTCASE( time->tm_mon == 11 );
    TESTCASE( time->tm_year == 1 );
    TESTCASE( time->tm_wday == 5 );
    TESTCASE( time->tm_yday == 346 );

    t = 2147483647l;
    time = gmtime( &t );
    TESTCASE( time->tm_sec == 7 );
    TESTCASE( time->tm_min == 14 );
    TESTCASE( time->tm_hour == 3 );
    TESTCASE( time->tm_mday == 19 );
    TESTCASE( time->tm_mon == 0 );
    TESTCASE( time->tm_year == 138 );
    TESTCASE( time->tm_wday == 2 );
    TESTCASE( time->tm_yday == 18 );

    return TEST_RESULTS;
}